

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O1

_Bool Curl_ssl_getsessionid(connectdata *conn,void **ssl_sessionid,size_t *idsize,int sockindex)

{
  curl_proxytype cVar1;
  uint uVar2;
  Curl_easy *pCVar3;
  char *first;
  Curl_share *pCVar4;
  curl_ssl_session *pcVar5;
  char *second;
  long lVar6;
  ssl_primary_config *data;
  proxy_info *ppVar7;
  _Bool _Var8;
  int iVar9;
  long *plVar10;
  byte bVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  bool bVar15;
  bool bVar16;
  
  cVar1 = (conn->http_proxy).proxytype;
  if (cVar1 == CURLPROXY_HTTPS) {
    bVar11 = (conn->bits).proxy_ssl_connected[sockindex] ^ 1;
  }
  else {
    bVar11 = 0;
  }
  data = &conn->ssl_config;
  ppVar7 = (proxy_info *)&conn->host;
  if (bVar11 == 0) {
    iVar12 = conn->remote_port;
  }
  else {
    iVar12 = (int)conn->port;
    data = &conn->proxy_ssl_config;
    ppVar7 = &conn->http_proxy;
  }
  pCVar3 = conn->data;
  first = (ppVar7->host).name;
  *ssl_sessionid = (void *)0x0;
  if ((cVar1 == CURLPROXY_HTTPS) &&
     (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
    bVar11 = (pCVar3->set).proxy_ssl.primary.field_0x48;
  }
  else {
    bVar11 = (pCVar3->set).ssl.primary.field_0x48;
  }
  bVar16 = true;
  if ((bVar11 & 8) != 0) {
    pCVar4 = pCVar3->share;
    if ((pCVar4 == (Curl_share *)0x0) || ((pCVar4->specifier & 0x10) == 0)) {
      plVar10 = &(pCVar3->state).sessionage;
    }
    else {
      plVar10 = &pCVar4->sessionage;
    }
    bVar16 = (pCVar3->set).general_ssl.max_ssl_sessions == 0;
    if (!bVar16) {
      lVar14 = 0x38;
      uVar13 = 0;
      do {
        pcVar5 = (pCVar3->state).session;
        if ((*(long *)((long)pcVar5 + lVar14 + -0x20) != 0) &&
           (iVar9 = Curl_strcasecompare(first,*(char **)((long)pcVar5 + lVar14 + -0x38)), iVar9 != 0
           )) {
          uVar2 = *(uint *)&(conn->bits).field_0x4;
          if ((uVar2 & 4) == 0) {
            if (*(long *)((long)pcVar5 + lVar14 + -0x30) != 0) {
              if ((uVar2 & 4) == 0) goto LAB_0014d8a8;
              goto LAB_0014d82f;
            }
          }
          else {
LAB_0014d82f:
            second = *(char **)((long)pcVar5 + lVar14 + -0x30);
            if ((second == (char *)0x0) ||
               (iVar9 = Curl_strcasecompare((conn->conn_to_host).name,second), iVar9 == 0))
            goto LAB_0014d8a8;
          }
          uVar2 = *(uint *)&(conn->bits).field_0x4;
          if ((uVar2 & 8) == 0) {
            if (*(int *)((long)pcVar5 + lVar14 + -4) != -1) {
              if ((uVar2 & 8) == 0) goto LAB_0014d8a8;
              goto LAB_0014d860;
            }
          }
          else {
LAB_0014d860:
            iVar9 = *(int *)((long)pcVar5 + lVar14 + -4);
            if ((iVar9 == -1) || (conn->conn_to_port != iVar9)) goto LAB_0014d8a8;
          }
          if ((iVar12 == *(int *)((long)pcVar5 + lVar14 + -8)) &&
             ((iVar9 = Curl_strcasecompare(conn->handler->scheme,
                                           *(char **)((long)pcVar5 + lVar14 + -0x28)), iVar9 != 0 &&
              (_Var8 = Curl_ssl_config_matches
                                 (data,(ssl_primary_config *)((long)&pcVar5->name + lVar14)), _Var8)
              ))) {
            lVar6 = *plVar10;
            *plVar10 = lVar6 + 1;
            *(long *)((long)pcVar5 + lVar14 + -0x10) = lVar6 + 1;
            *ssl_sessionid = *(void **)((long)pcVar5 + lVar14 + -0x20);
            if (idsize != (size_t *)0x0) {
              *idsize = *(size_t *)((long)pcVar5 + lVar14 + -0x18);
            }
            return false;
          }
        }
LAB_0014d8a8:
        uVar13 = uVar13 + 1;
        lVar14 = lVar14 + 0x88;
        bVar15 = uVar13 < (pCVar3->set).general_ssl.max_ssl_sessions;
        bVar16 = !bVar15;
      } while (bVar15);
    }
  }
  return bVar16;
}

Assistant:

bool Curl_ssl_getsessionid(struct connectdata *conn,
                           void **ssl_sessionid,
                           size_t *idsize, /* set 0 if unknown */
                           int sockindex)
{
  struct curl_ssl_session *check;
  struct Curl_easy *data = conn->data;
  size_t i;
  long *general_age;
  bool no_match = TRUE;

  const bool isProxy = CONNECT_PROXY_SSL();
  struct ssl_primary_config * const ssl_config = isProxy ?
    &conn->proxy_ssl_config :
    &conn->ssl_config;
  const char * const name = isProxy ? conn->http_proxy.host.name :
    conn->host.name;
  int port = isProxy ? (int)conn->port : conn->remote_port;
  *ssl_sessionid = NULL;

  DEBUGASSERT(SSL_SET_OPTION(primary.sessionid));

  if(!SSL_SET_OPTION(primary.sessionid))
    /* session ID re-use is disabled */
    return TRUE;

  /* Lock if shared */
  if(SSLSESSION_SHARED(data))
    general_age = &data->share->sessionage;
  else
    general_age = &data->state.sessionage;

  for(i = 0; i < data->set.general_ssl.max_ssl_sessions; i++) {
    check = &data->state.session[i];
    if(!check->sessionid)
      /* not session ID means blank entry */
      continue;
    if(strcasecompare(name, check->name) &&
       ((!conn->bits.conn_to_host && !check->conn_to_host) ||
        (conn->bits.conn_to_host && check->conn_to_host &&
         strcasecompare(conn->conn_to_host.name, check->conn_to_host))) &&
       ((!conn->bits.conn_to_port && check->conn_to_port == -1) ||
        (conn->bits.conn_to_port && check->conn_to_port != -1 &&
         conn->conn_to_port == check->conn_to_port)) &&
       (port == check->remote_port) &&
       strcasecompare(conn->handler->scheme, check->scheme) &&
       Curl_ssl_config_matches(ssl_config, &check->ssl_config)) {
      /* yes, we have a session ID! */
      (*general_age)++;          /* increase general age */
      check->age = *general_age; /* set this as used in this age */
      *ssl_sessionid = check->sessionid;
      if(idsize)
        *idsize = check->idsize;
      no_match = FALSE;
      break;
    }
  }

  return no_match;
}